

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O2

Response * jaegertracing::net::http::get(Response *__return_storage_ptr__,URI *uri)

{
  int __v;
  ostream *poVar1;
  ssize_t sVar2;
  system_error *this;
  int *piVar3;
  error_category *__ecat;
  socklen_t in_ECX;
  size_t __nbytes;
  Socket socket;
  __string_type request;
  string local_330;
  ostringstream oss;
  ostringstream requestStream;
  
  Socket::Socket(&socket);
  Socket::open(&socket,(char *)0x2,1);
  Socket::connect((Socket *)&requestStream,(int)&socket,(sockaddr *)uri,in_ECX);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&requestStream);
  poVar1 = std::operator<<((ostream *)&requestStream,"GET ");
  URI::target_abi_cxx11_((string *)&oss,uri);
  poVar1 = std::operator<<(poVar1,(string *)&oss);
  poVar1 = std::operator<<(poVar1," HTTP/1.1\r\n");
  poVar1 = std::operator<<(poVar1,"Host: ");
  URI::authority_abi_cxx11_(&request,uri);
  poVar1 = std::operator<<(poVar1,(string *)&request);
  poVar1 = std::operator<<(poVar1,"\r\nUser-Agent: jaegertracing/");
  poVar1 = std::operator<<(poVar1,"C++-0.5.0");
  std::operator<<(poVar1,"\r\n\r\n");
  std::__cxx11::string::~string((string *)&request);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::stringbuf::str();
  sVar2 = ::write(socket._handle,request._M_dataplus._M_p,
                  CONCAT44(request._M_string_length._4_4_,(int)request._M_string_length));
  if (sVar2 == (int)request._M_string_length) {
    read((int)__return_storage_ptr__,&socket,__nbytes);
    std::__cxx11::string::~string((string *)&request);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&requestStream);
    Socket::~Socket(&socket);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Failed to write entire HTTP request");
  poVar1 = std::operator<<(poVar1,", uri=");
  URI::print<std::ostream>(uri,poVar1);
  poVar1 = std::operator<<(poVar1,", request=");
  std::operator<<(poVar1,(string *)&request);
  this = (system_error *)__cxa_allocate_exception(0x20);
  piVar3 = __errno_location();
  __v = *piVar3;
  std::__cxx11::stringbuf::str();
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this,__v,__ecat,&local_330);
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

Response get(const URI& uri)
{
    Socket socket;
    socket.open(AF_INET, SOCK_STREAM);
    socket.connect(uri);
    std::ostringstream requestStream;
    requestStream << "GET " << uri.target() << " HTTP/1.1\r\n"
                  << "Host: " << uri.authority()
                  << "\r\n"
                     "User-Agent: jaegertracing/"
                  << kJaegerClientVersion << "\r\n\r\n";
    const auto request = requestStream.str();
#ifdef WIN32
    const auto numWritten = ::send(socket.handle(), request.c_str(), request.size(), 0);
#else
    const auto numWritten = ::write(socket.handle(), request.c_str(), request.size());
#endif
    if (numWritten != static_cast<int>(request.size())) {
        std::ostringstream oss;
        oss << "Failed to write entire HTTP request"
            << ", uri=" << uri << ", request=" << request;
        throw std::system_error(errno, std::system_category(), oss.str());
    }

  return read(socket);
}